

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Move.h
# Opt level: O0

string * __thiscall libchess::Move::to_str_abi_cxx11_(Move *this)

{
  bool bVar1;
  char cVar2;
  Square SVar3;
  string *in_RDI;
  optional<libchess::PieceType> promotion_pt;
  string *move_str;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  string local_60 [8];
  Square *in_stack_ffffffffffffffa8;
  string local_38 [39];
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  from_square((Move *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  Square::to_str_abi_cxx11_(in_stack_ffffffffffffffa8);
  SVar3 = to_square((Move *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  Square::to_str_abi_cxx11_(in_stack_ffffffffffffffa8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(SVar3.super_MetaValueType<int>.value_,in_stack_ffffffffffffff98),
                 in_stack_ffffffffffffff90);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_38);
  promotion_piece_type((Move *)this_00);
  bVar1 = std::optional::operator_cast_to_bool((optional<libchess::PieceType> *)0x1233d9);
  if (bVar1) {
    std::optional<libchess::PieceType>::operator->((optional<libchess::PieceType> *)0x1233e9);
    cVar2 = PieceType::to_char((PieceType *)
                               CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    std::__cxx11::string::operator+=((string *)this_00,cVar2);
  }
  return in_RDI;
}

Assistant:

std::string to_str() const {
        std::string move_str = from_square().to_str() + to_square().to_str();
        auto promotion_pt = promotion_piece_type();
        if (promotion_pt) {
            move_str += promotion_pt->to_char();
        }
        return move_str;
    }